

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractFlowAnalysis.h
# Opt level: O2

void __thiscall
slang::analysis::AbstractFlowAnalysis<TestAnalysis,_int>::visitStmt
          (AbstractFlowAnalysis<TestAnalysis,_int> *this,CaseStatement *stmt)

{
  pointer ppEVar1;
  size_t sVar2;
  Statement *this_00;
  bool bVar3;
  pointer pIVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  ItemGroup *item;
  pointer pIVar10;
  pair<const_slang::ast::Statement_*,_bool> pVar11;
  
  ast::Expression::visit<TestAnalysis&>(stmt->expr,(TestAnalysis *)this);
  pVar11 = ast::CaseStatement::getKnownBranch(stmt,&(this->super_FlowAnalysisBase).evalContext);
  iVar7 = this->state;
  pIVar10 = (stmt->items)._M_ptr;
  pIVar4 = pIVar10 + (stmt->items)._M_extent._M_extent_value;
  iVar8 = 0;
  do {
    if (pIVar10 == pIVar4) {
      bVar3 = analysis::FlowAnalysisBase::isFullyCovered(&this->super_FlowAnalysisBase,stmt);
      this_00 = stmt->defaultCase;
      if (this_00 == (Statement *)0x0) {
        if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          iVar7 = 0;
        }
        if (bVar3) {
          iVar7 = 0;
        }
      }
      else {
        iVar6 = 0;
        if (!bVar3 && (pVar11.second & pVar11.first != this_00) == 0) {
          this->isStateSplit = false;
          this->stateWhenTrue = 0;
          this->stateWhenFalse = 0;
          iVar6 = iVar7;
        }
        this->state = iVar6;
        ast::Statement::visit<TestAnalysis&>(this_00,(TestAnalysis *)this);
        iVar7 = this->state;
      }
      this->isStateSplit = false;
      this->state = iVar7 + iVar8;
      this->stateWhenTrue = 0;
      this->stateWhenFalse = 0;
      return;
    }
    if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
LAB_001cde40:
      this->isStateSplit = false;
      this->state = iVar7;
      this->stateWhenTrue = 0;
      piVar5 = &this->stateWhenFalse;
    }
    else {
      piVar5 = &this->state;
      if (pVar11.first == (pIVar10->stmt).ptr) goto LAB_001cde40;
    }
    *piVar5 = 0;
    ppEVar1 = (pIVar10->expressions)._M_ptr;
    sVar2 = (pIVar10->expressions)._M_extent._M_extent_value;
    for (lVar9 = 0; sVar2 << 3 != lVar9; lVar9 = lVar9 + 8) {
      ast::Expression::visit<TestAnalysis&>
                (*(Expression **)((long)ppEVar1 + lVar9),(TestAnalysis *)this);
    }
    ast::Statement::visit<TestAnalysis&>((pIVar10->stmt).ptr,(TestAnalysis *)this);
    iVar8 = iVar8 + this->state;
    pIVar10 = pIVar10 + 1;
  } while( true );
}

Assistant:

void visitStmt(const CaseStatement& stmt) {
        visit(stmt.expr);

        // If the branch is known we can visit it explicitly,
        // otherwise we need to merge states for all case items.
        // TODO: report warnings from the eval here?
        auto [knownBranch, isKnown] = stmt.getKnownBranch(evalContext);

        auto initialState = std::move(state);
        auto finalState = (DERIVED).unreachableState();

        for (auto& item : stmt.items) {
            if (isKnown && knownBranch != item.stmt)
                setUnreachable();
            else
                setState((DERIVED).copyState(initialState));

            for (auto itemExpr : item.expressions)
                visit(*itemExpr);

            visit(*item.stmt);
            (DERIVED).joinState(finalState, state);
        }

        // Determine whether the case statement has full coverage of all possible
        // inputs, such that we're guaranteed to select one of the case items.
        const bool covered = isFullyCovered(stmt);

        if (stmt.defaultCase) {
            // If the case input is fully covered by item expressions,
            // or if we have a statically known branch that is not the
            // default, then we know the default case is never hit.
            if (covered || (isKnown && knownBranch != stmt.defaultCase))
                setUnreachable();
            else
                setState((DERIVED).copyState(initialState));

            visit(*stmt.defaultCase);
            (DERIVED).joinState(finalState, state);
        }
        else if (!isKnown && !covered) {
            // Branch is not statically known and the case input is
            // not fully covered, so we have to assume that no item
            // may be selected and that the initial state is relevant.
            (DERIVED).joinState(finalState, initialState);
        }

        setState(std::move(finalState));
    }